

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

QPDF_ERROR_CODE
qpdf_read_memory(qpdf_data qpdf,char *description,char *buffer,unsigned_long_long size,
                char *password)

{
  QPDF_ERROR_CODE QVar1;
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  qpdf->filename = description;
  qpdf->buffer = buffer;
  qpdf->size = size;
  qpdf->password = password;
  local_28[1] = (code *)0x0;
  local_28[0] = call_read_memory;
  local_10 = std::_Function_handler<void_(_qpdf_data_*),_void_(*)(_qpdf_data_*)>::_M_invoke;
  local_18 = std::_Function_handler<void_(_qpdf_data_*),_void_(*)(_qpdf_data_*)>::_M_manager;
  QVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)local_28);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_read_memory(
    qpdf_data qpdf,
    char const* description,
    char const* buffer,
    unsigned long long size,
    char const* password)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    qpdf->filename = description;
    qpdf->buffer = buffer;
    qpdf->size = size;
    qpdf->password = password;
    status = trap_errors(qpdf, &call_read_memory);
    QTC::TC("qpdf", "qpdf-c called qpdf_read_memory", status);
    return status;
}